

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

cupdlp_retcode
csc_alloc_matrix(CUPDLPcsc *csc,cupdlp_int nRows,cupdlp_int nCols,void *src,
                CUPDLP_MATRIX_FORMAT src_matrix_format)

{
  int iVar1;
  cupdlp_int *__dest;
  cupdlp_int *__dest_00;
  cupdlp_float *__dest_01;
  cupdlp_retcode cVar2;
  cupdlp_retcode cVar3;
  int iVar4;
  
  if ((src_matrix_format == CSC) || (src_matrix_format == CSR)) {
    iVar4 = *(int *)((long)src + 8);
  }
  else {
    iVar4 = 0;
    if (src_matrix_format == DENSE) {
      iVar4 = nRows * nCols;
    }
  }
  __dest = (cupdlp_int *)calloc((long)(nCols + 1),4);
  csc->colMatBeg = __dest;
  cVar3 = 1;
  if (__dest != (cupdlp_int *)0x0) {
    __dest_00 = (cupdlp_int *)calloc((long)iVar4,4);
    csc->colMatIdx = __dest_00;
    if (__dest_00 != (cupdlp_int *)0x0) {
      __dest_01 = (cupdlp_float *)calloc((long)iVar4,8);
      csc->colMatElem = __dest_01;
      if (__dest_01 != (cupdlp_float *)0x0) {
        cVar2 = 0;
        cVar3 = cVar2;
        if (src_matrix_format == CSC) {
          csc->nRows = *src;
          iVar4 = *(int *)((long)src + 4);
          csc->nCols = iVar4;
          iVar1 = *(int *)((long)src + 8);
          csc->nMatElem = iVar1;
          memcpy(__dest,*(void **)((long)src + 0x10),(long)iVar4 * 4 + 4);
          memcpy(__dest_00,*(void **)((long)src + 0x18),(long)iVar1 * 4);
          memcpy(__dest_01,*(void **)((long)src + 0x20),(long)iVar1 << 3);
        }
        else if (src_matrix_format == CSR) {
          csr2csc(csc,(CUPDLPcsr *)src);
        }
        else {
          cVar3 = 0;
          if (src_matrix_format == DENSE) {
            dense2csc(csc,(CUPDLPdense *)src);
            cVar3 = cVar2;
          }
        }
      }
    }
  }
  return cVar3;
}

Assistant:

cupdlp_retcode csc_alloc_matrix(CUPDLPcsc *csc, cupdlp_int nRows,
                                cupdlp_int nCols, void *src,
                                CUPDLP_MATRIX_FORMAT src_matrix_format) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nnz = 0;
  switch (src_matrix_format) {
    case DENSE:
      nnz = nRows * nCols;
      break;
    case CSR:
      nnz = ((CUPDLPcsr *)src)->nMatElem;
      break;
    case CSC:
      nnz = ((CUPDLPcsc *)src)->nMatElem;
      break;
    default:
      break;
  }

  cupdlp_init_zero_vec_int(csc->colMatBeg, nCols + 1);
  cupdlp_init_zero_vec_int(csc->colMatIdx, nnz);
  cupdlp_init_zero_vec_double(csc->colMatElem, nnz);

  switch (src_matrix_format) {
    case DENSE:
      dense2csc(csc, (CUPDLPdense *)src);
      break;
    case CSR:
      csr2csc(csc, (CUPDLPcsr *)src);
      break;
    case CSC:
      csc_copy(csc, (CUPDLPcsc *)src);
      break;
    default:
      break;
  }
exit_cleanup:
  return retcode;
}